

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O3

void __thiscall
ParticleArrayTest_Size_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>_>::TestBody
          (ParticleArrayTest_Size_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>_>
           *this)

{
  void *pvVar1;
  PositionType minPosition;
  Particle<(pica::Dimension)3> particle;
  PositionType maxPosition;
  bool bVar2;
  long lVar3;
  int i;
  int iVar4;
  Particle *pPVar5;
  double *pdVar6;
  char *message;
  byte bVar7;
  int numParticles;
  PositionType position_1;
  PositionType position;
  ParticleArray particles;
  double dVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 in_stack_fffffffffffffe48 [24];
  int local_194;
  AssertHelper local_190;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_160;
  undefined8 local_158;
  ParticleArraySoA<pica::Particle<(pica::Dimension)3>> local_150 [144];
  void *local_c0;
  long local_b0;
  void *local_a8;
  long local_98;
  void *local_90;
  long local_88;
  long local_80;
  Particle local_78;
  
  bVar7 = 0;
  iVar4 = 0;
  memset(local_150,0,0xd8);
  local_194 = 0xc;
  do {
    local_168.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc024000000000000;
    sStack_160.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc024000000000000;
    local_158 = 0xc024000000000000;
    local_188.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         0x4024000000000000;
    uStack_180 = 0x4024000000000000;
    local_178 = 0x4024000000000000;
    uVar13 = 0x4024000000000000;
    uVar11 = 0x4024000000000000;
    uVar12 = 0x4024000000000000;
    uVar10 = 0xc024000000000000;
    dVar8 = -10.0;
    uVar9 = 0xc024000000000000;
    minPosition.y = -10.0;
    minPosition.x = -10.0;
    minPosition.z = -10.0;
    maxPosition.y = 10.0;
    maxPosition.x = 10.0;
    maxPosition.z = 10.0;
    BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>::randomParticle
              (&local_78,(BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *)this,
               minPosition,maxPosition);
    pPVar5 = &local_78;
    pdVar6 = (double *)&stack0xfffffffffffffe18;
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      *pdVar6 = (pPVar5->position).x;
      pPVar5 = (Particle *)((long)pPVar5 + (ulong)bVar7 * -0x10 + 8);
      pdVar6 = pdVar6 + (ulong)bVar7 * -2 + 1;
    }
    particle.position.y = (double)uVar9;
    particle.position.x = dVar8;
    particle.position.z = (double)uVar10;
    particle.p.x = (double)uVar11;
    particle.p.y = (double)uVar12;
    particle.p.z = (double)uVar13;
    particle.factor = (FactorType)in_stack_fffffffffffffe48._0_8_;
    particle.invGamma = (GammaType)in_stack_fffffffffffffe48._8_8_;
    particle.typeIndex = in_stack_fffffffffffffe48._16_2_;
    particle._66_6_ = in_stack_fffffffffffffe48._18_6_;
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>>::
    pushBack<pica::Particle<(pica::Dimension)3>>(local_150,particle);
    iVar4 = iVar4 + 1;
  } while (iVar4 < local_194);
  local_188.ptr_._0_4_ = (int)((ulong)(local_88 - (long)local_90) >> 1);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_168,"numParticles","particles.size()",&local_194,(int *)&local_188);
  if (local_168.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (sStack_160.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = *(char **)sStack_160.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
               ,0x45,message);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_188.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_188.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_188.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_160,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_90 != (void *)0x0) {
    operator_delete(local_90,local_80 - (long)local_90);
  }
  if (local_a8 != (void *)0x0) {
    operator_delete(local_a8,local_98 - (long)local_a8);
  }
  if (local_c0 != (void *)0x0) {
    operator_delete(local_c0,local_b0 - (long)local_c0);
  }
  lVar3 = 0x88;
  do {
    pvVar1 = *(void **)((long)&sStack_160.ptr_ + lVar3);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)(local_150 + lVar3) - (long)pvVar1);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != 0x40);
  lVar3 = 0x48;
  do {
    pvVar1 = *(void **)((long)&local_168.ptr_ + lVar3);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)(local_150 + lVar3 + -8) - (long)pvVar1);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != 0);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, Size)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;

    ParticleArray particles;
    int numParticles = 12;
    for (int i = 0; i < numParticles; i++)
        particles.pushBack(this->randomParticle());
    ASSERT_EQ(numParticles, particles.size());
}